

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

tensor * __thiscall EXP::forward(EXP *this,vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  size_type __new_size;
  tensor *this_00;
  reference pptVar1;
  reference pvVar2;
  double dVar3;
  vector<tensor_*,_std::allocator<tensor_*>_> *x_local;
  EXP *this_local;
  
  (this->super_node).isbuild = true;
  __new_size = std::vector<tensor_*,_std::allocator<tensor_*>_>::size(x);
  std::vector<double,_std::allocator<double>_>::resize(&(this->super_node).grad_fn,__new_size);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  this_00 = (tensor *)operator_new(0x20);
  tensor::tensor(this_00,0.0,0.0,0);
  (this->super_node).ret = this_00;
  pptVar1 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,0);
  dVar3 = exp((*pptVar1)->data);
  ((this->super_node).ret)->data = dVar3;
  pptVar1 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,0);
  dVar3 = exp((*pptVar1)->data);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&(this->super_node).grad_fn,0);
  *pvVar2 = dVar3;
  pptVar1 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,0);
  (*pptVar1)->cnt = (*pptVar1)->cnt + 1;
  pptVar1 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,0);
  (*pptVar1)->cnt_free = (*pptVar1)->cnt_free + 1;
  ((this->super_node).ret)->hook = &this->super_node;
  return (this->super_node).ret;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = exp(input[0]->data);
        grad_fn[0] = exp(input[0]->data);
        input[0]->cnt++;
        input[0]->cnt_free++;
        ret->hook=this;
        return ret;
    }